

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double fppow2(int n)

{
  int iVar1;
  double dVar2;
  
  if (n != 0) {
    iVar1 = -n;
    if (n != iVar1 && SBORROW4(n,iVar1) == n * 2 < 0) {
      iVar1 = n;
    }
    iVar1 = iVar1 + 1;
    dVar2 = 1.0;
    do {
      dVar2 = dVar2 * *(double *)(&DAT_001785e0 + (ulong)((uint)n >> 0x1f) * 8);
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
    return dVar2;
  }
  return 1.0;
}

Assistant:

double fppow2(int n)
{
  double x, power;
  x = (n < 0) ? ((double)1.0/(double)2.0) : (double)2.0;
  n = (n < 0) ? -n : n;
  power = (double)1.0;
  while (n-- > 0)
	power *= x;
  return (power);
}